

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QByteArray,_QByteArray>::find(QMap<QByteArray,_QByteArray> *this,QByteArray *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMap<QByteArray,_QByteArray> copy;
  iterator in_stack_ffffffffffffffb8;
  QMap<QByteArray,_QByteArray> *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffc0->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffffc0,(QMap<QByteArray,_QByteArray> *)in_stack_ffffffffffffffb8._M_node
        );
  }
  else {
    memset(&local_18,0,8);
    QMap((QMap<QByteArray,_QByteArray> *)0x1501bd);
  }
  detach(in_stack_ffffffffffffffc0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                *)0x1501d1);
  std::
  map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
  ::find((map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
          *)in_stack_ffffffffffffffb8._M_node,(key_type *)0x1501e2);
  iterator::iterator((iterator *)0x1501f6,in_stack_ffffffffffffffb8);
  ~QMap((QMap<QByteArray,_QByteArray> *)0x150200);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }